

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O2

FT_Error tt_face_load_gasp(TT_Face face,FT_Stream stream)

{
  FT_Memory memory;
  FT_UInt16 FVar1;
  FT_UInt16 FVar2;
  FT_Error FVar3;
  undefined8 in_RAX;
  TT_GaspRange P;
  ulong uVar4;
  FT_Error error;
  undefined4 uStack_34;
  
  uStack_34 = (undefined4)((ulong)in_RAX >> 0x20);
  memory = stream->memory;
  P = (TT_GaspRange)0x0;
  FVar3 = (*face->goto_table)(face,0x67617370,stream,(FT_ULong *)0x0);
  _error = CONCAT44(uStack_34,FVar3);
  if (FVar3 != 0) goto LAB_002067df;
  FVar3 = FT_Stream_EnterFrame(stream,4);
  _error = CONCAT44(uStack_34,FVar3);
  if (FVar3 == 0) {
    FVar1 = FT_Stream_GetUShort(stream);
    (face->gasp).version = FVar1;
    FVar1 = FT_Stream_GetUShort(stream);
    FT_Stream_ExitFrame(stream);
    if ((face->gasp).version < 2) {
      _error = CONCAT26(FVar1,_error);
      P = (TT_GaspRange)ft_mem_qrealloc(memory,4,0,(ulong)FVar1,(void *)0x0,&error);
      if (error != 0) goto LAB_002067df;
      FVar3 = FT_Stream_EnterFrame(stream,(ulong)((uint)FVar1 * 4));
      _error = CONCAT44(uStack_34,FVar3);
      if (FVar3 != 0) goto LAB_002067df;
      for (uVar4 = 0; FVar1 != uVar4; uVar4 = uVar4 + 1) {
        FVar2 = FT_Stream_GetUShort(stream);
        P[uVar4].maxPPEM = FVar2;
        FVar2 = FT_Stream_GetUShort(stream);
        P[uVar4].gaspFlag = FVar2;
      }
      (face->gasp).gaspRanges = P;
      (face->gasp).numRanges = uStack_34._2_2_;
      FT_Stream_ExitFrame(stream);
    }
    else {
      (face->gasp).numRanges = 0;
      _error = CONCAT44(uStack_34,8);
    }
  }
  P = (TT_GaspRange)0x0;
LAB_002067df:
  ft_mem_free(memory,P);
  return error;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_gasp( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error   error;
    FT_Memory  memory = stream->memory;

    FT_UShort      j, num_ranges;
    TT_GaspRange   gasp_ranges = NULL;


    /* the gasp table is optional */
    error = face->goto_table( face, TTAG_gasp, stream, 0 );
    if ( error )
      goto Exit;

    if ( FT_FRAME_ENTER( 4L ) )
      goto Exit;

    face->gasp.version = FT_GET_USHORT();
    num_ranges         = FT_GET_USHORT();

    FT_FRAME_EXIT();

    /* only support versions 0 and 1 of the table */
    if ( face->gasp.version >= 2 )
    {
      face->gasp.numRanges = 0;
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    FT_TRACE3(( "numRanges: %hu\n", num_ranges ));

    if ( FT_QNEW_ARRAY( gasp_ranges, num_ranges ) ||
         FT_FRAME_ENTER( num_ranges * 4L )        )
      goto Exit;

    for ( j = 0; j < num_ranges; j++ )
    {
      gasp_ranges[j].maxPPEM  = FT_GET_USHORT();
      gasp_ranges[j].gaspFlag = FT_GET_USHORT();

      FT_TRACE3(( "gaspRange %hu: rangeMaxPPEM %5hu, rangeGaspBehavior 0x%hx\n",
                  j,
                  gasp_ranges[j].maxPPEM,
                  gasp_ranges[j].gaspFlag ));
    }

    face->gasp.gaspRanges = gasp_ranges;
    gasp_ranges           = NULL;
    face->gasp.numRanges  = num_ranges;

    FT_FRAME_EXIT();

  Exit:
    FT_FREE( gasp_ranges );
    return error;
  }